

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_formatimpl.cpp
# Opt level: O0

int32_t icu_63::number::impl::NumberFormatterImpl::writeFractionDigits
                  (MicroProps *micros,DecimalQuantity *quantity,NumberStringBuilder *string,
                  int32_t index,UErrorCode *status)

{
  int8_t digit;
  int32_t iVar1;
  int32_t iVar2;
  int local_3c;
  int8_t nextDigit;
  int i;
  int fractionCount;
  int length;
  UErrorCode *status_local;
  int32_t index_local;
  NumberStringBuilder *string_local;
  DecimalQuantity *quantity_local;
  MicroProps *micros_local;
  
  i = 0;
  iVar1 = DecimalQuantity::getLowerDisplayMagnitude(quantity);
  for (local_3c = 0; local_3c < -iVar1; local_3c = local_3c + 1) {
    digit = DecimalQuantity::getDigit(quantity,-1 - local_3c);
    iVar2 = utils::insertDigitFromSymbols
                      (string,i + index,digit,micros->symbols,UNUM_FRACTION_FIELD,status);
    i = iVar2 + i;
  }
  return i;
}

Assistant:

int32_t NumberFormatterImpl::writeFractionDigits(const MicroProps& micros, DecimalQuantity& quantity,
                                                 NumberStringBuilder& string, int32_t index,
                                                 UErrorCode& status) {
    int length = 0;
    int fractionCount = -quantity.getLowerDisplayMagnitude();
    for (int i = 0; i < fractionCount; i++) {
        // Get and append the next digit value
        int8_t nextDigit = quantity.getDigit(-i - 1);
        length += utils::insertDigitFromSymbols(
                string, length + index, nextDigit, *micros.symbols, UNUM_FRACTION_FIELD, status);
    }
    return length;
}